

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O1

void dumpVarint(DumpState *D,size_t x)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  lu_byte buff [10];
  byte local_1a [9];
  byte local_11;
  
  local_11 = (byte)x & 0x7f;
  sVar3 = 1;
  if (0x7f < x) {
    lVar4 = -1;
    do {
      local_1a[(int)lVar4 + 9] = (byte)(x >> 7) | 0x80;
      lVar4 = lVar4 + -1;
      bVar1 = 0x3fff < x;
      x = x >> 7;
    } while (bVar1);
    sVar3 = -lVar4;
  }
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&stack0xfffffffffffffff0 + -sVar3,sVar3,D->data);
    D->status = iVar2;
    D->offset = D->offset + sVar3;
  }
  return;
}

Assistant:

static void dumpVarint (DumpState *D, size_t x) {
  lu_byte buff[DIBS];
  unsigned n = 1;
  buff[DIBS - 1] = x & 0x7f;  /* fill least-significant byte */
  while ((x >>= 7) != 0)  /* fill other bytes in reverse order */
    buff[DIBS - (++n)] = cast_byte((x & 0x7f) | 0x80);
  dumpVector(D, buff + DIBS - n, n);
}